

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

void Image_Function_Helper::Transpose(TransposeForm4 transpose,Image *in,Image *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 in_RDX;
  ImageTemplate<unsigned_char> *in_RSI;
  code *in_RDI;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffd0;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffd0);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffd0);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
  (*in_RDI)(in_RSI,0,0,in_RDX,0,0,uVar1,uVar2);
  return;
}

Assistant:

void Transpose( FunctionTable::TransposeForm4 transpose,
                    const Image & in, Image & out )
    {
        Image_Function::ParameterValidation( in );
        Image_Function::ParameterValidation( out );

        transpose( in, 0, 0, out, 0, 0, in.width(), in.height() );
    }